

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

TargetFrameSubDescriptor * __thiscall
ASDCP::MXF::TargetFrameSubDescriptor::WriteToTLVSet
          (TargetFrameSubDescriptor *this,TLVWriter *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x11f2,
                  "virtual ASDCP::Result_t ASDCP::MXF::TargetFrameSubDescriptor::WriteToTLVSet(TLVWriter &)"
                 );
  }
  InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_TargetFrameSubDescriptor_TargetFrameAncillaryResourceID);
    TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                MDD_TargetFrameSubDescriptor_MediaType);
      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
        pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                  MDD_TargetFrameSubDescriptor_TargetFrameIndex);
        TLVWriter::WriteUi64(&local_80,in_RDX,(ui64_t *)pMVar1);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
          pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                    MDD_TargetFrameSubDescriptor_TargetFrameTransferCharacteristic);
          TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
            pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                      MDD_TargetFrameSubDescriptor_TargetFrameColorPrimaries);
            TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
              pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                        MDD_TargetFrameSubDescriptor_TargetFrameComponentMaxRef);
              TLVWriter::WriteUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
              Kumu::Result_t::~Result_t((Result_t *)&local_80);
              if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
                pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                          MDD_TargetFrameSubDescriptor_TargetFrameComponentMinRef);
                TLVWriter::WriteUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
                Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                Kumu::Result_t::~Result_t((Result_t *)&local_80);
                if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
                  pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                            MDD_TargetFrameSubDescriptor_TargetFrameEssenceStreamID)
                  ;
                  TLVWriter::WriteUi32(&local_80,in_RDX,(ui32_t *)pMVar1);
                  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                  Kumu::Result_t::~Result_t((Result_t *)&local_80);
                  if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket)
                  {
                    if (*(char *)&TLVSet[4].m_Lookup == '\x01') {
                      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                                MDD_TargetFrameSubDescriptor_ACESPictureSubDescriptorInstanceID
                                               );
                      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                      Kumu::Result_t::~Result_t((Result_t *)&local_80);
                      if (*(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket <
                          0) {
                        return this;
                      }
                    }
                    if (*(char *)&TLVSet[5].m_ElementMap._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent == '\x01') {
                      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                                MDD_TargetFrameSubDescriptor_TargetFrameViewingEnvironment
                                               );
                      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
                      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
                      Kumu::Result_t::~Result_t((Result_t *)&local_80);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
TargetFrameSubDescriptor::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameAncillaryResourceID));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, MediaType));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi64(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameIndex));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameTransferCharacteristic));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameColorPrimaries));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameComponentMaxRef));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameComponentMinRef));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(TargetFrameSubDescriptor, TargetFrameEssenceStreamID));
  if ( ASDCP_SUCCESS(result)  && ! ACESPictureSubDescriptorInstanceID.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(TargetFrameSubDescriptor, ACESPictureSubDescriptorInstanceID));
  if ( ASDCP_SUCCESS(result)  && ! TargetFrameViewingEnvironment.empty() ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(TargetFrameSubDescriptor, TargetFrameViewingEnvironment));
  return result;
}